

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

DdNode * Cudd_addIthVar(DdManager *dd,int i)

{
  DdNode *pDVar1;
  
  if ((uint)i < 0x7ffffffe) {
    do {
      dd->reordered = 0;
      pDVar1 = cuddUniqueInter(dd,i,dd->one,dd->zero);
    } while (dd->reordered == 1);
    return pDVar1;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addIthVar(
  DdManager * dd,
  int  i)
{
    DdNode *res;

    if ((unsigned int) i >= CUDD_MAXINDEX - 1) return(NULL);
    do {
        dd->reordered = 0;
        res = cuddUniqueInter(dd,i,DD_ONE(dd),DD_ZERO(dd));
    } while (dd->reordered == 1);

    return(res);

}